

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_lazy2_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pBVar1;
  undefined8 *puVar2;
  U32 *pUVar3;
  char cVar4;
  undefined8 uVar5;
  ZSTD_matchState_t *pZVar6;
  U32 lowestValid;
  byte bVar7;
  uint uVar8;
  ulong *puVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  ulong *puVar13;
  BYTE *pBVar14;
  uint uVar15;
  long lVar16;
  seqDef *psVar17;
  ulong uVar18;
  ulong *puVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong *puVar25;
  seqStore_t *psVar26;
  BYTE *litEnd;
  ulong uVar27;
  ulong *puVar28;
  size_t offbaseFound;
  BYTE *pInLoopLimit;
  BYTE *litLimit_w;
  size_t local_d8;
  uint local_d0;
  uint local_cc;
  ulong *local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  ZSTD_matchState_t *local_b0;
  ulong *local_a8;
  ulong *local_a0;
  BYTE *local_98;
  ulong *local_90;
  ulong *local_88;
  ulong *local_80;
  seqStore_t *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  BYTE *local_60;
  long local_58;
  ulong *local_50;
  uint *local_48;
  ulong local_40;
  ulong local_38;
  
  local_98 = (ms->window).base;
  uVar15 = (ms->window).dictLimit;
  local_60 = local_98 + uVar15;
  local_b8 = (ms->cParams).minMatch;
  if (5 < local_b8) {
    local_b8 = 6;
  }
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  local_b4 = (ms->cParams).searchLog;
  local_d0 = 6;
  if (local_b4 < 6) {
    local_d0 = local_b4;
  }
  if (local_d0 < 5) {
    local_d0 = 4;
  }
  puVar25 = (ulong *)((ulong)((int)src == (int)local_60) + (long)src);
  uVar20 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  iVar12 = (int)puVar25 - (int)local_98;
  local_68 = *rep;
  local_64 = iVar12 - uVar20;
  if (iVar12 - uVar15 <= uVar20) {
    local_64 = uVar15;
  }
  uVar20 = 0;
  if (ms->loadedDictEnd != 0) {
    local_64 = uVar15;
  }
  local_6c = rep[1];
  local_64 = iVar12 - local_64;
  uVar15 = local_6c;
  if (local_64 < local_6c) {
    uVar15 = uVar20;
  }
  uVar21 = local_68;
  if (local_64 < local_68) {
    uVar21 = uVar20;
  }
  ms->lazySkipping = 0;
  local_a8 = (ulong *)((long)src + (srcSize - 0x10));
  uVar8 = ms->nextToUpdate;
  uVar27 = (ulong)uVar8;
  uVar10 = ((int)local_a8 - (int)(local_98 + uVar27)) + 1;
  uVar22 = 8;
  if (uVar10 < 8) {
    uVar22 = uVar10;
  }
  if (local_a8 < local_98 + uVar27) {
    uVar22 = uVar20;
  }
  bVar7 = (byte)local_d0;
  local_cc = uVar15;
  local_b0 = ms;
  local_78 = seqStore;
  local_48 = rep;
  if (uVar8 < uVar22 + uVar8) {
    local_c8 = (ulong *)srcSize;
    local_bc = uVar21;
    if (0x20 < ms->rowHashLog + 8) {
LAB_007f7778:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x353,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    pUVar3 = ms->hashTable;
    pBVar14 = ms->tagTable;
    uVar18 = ms->hashSalt;
    cVar4 = (char)ms->rowHashLog;
    do {
      if (local_b8 == 5) {
        uVar23 = *(long *)(local_98 + uVar27) * -0x30e4432345000000;
LAB_007f692e:
        uVar23 = (uVar23 ^ uVar18) >> (0x38U - cVar4 & 0x3f);
      }
      else {
        if (local_b8 == 6) {
          uVar23 = *(long *)(local_98 + uVar27) * -0x30e4432340650000;
          goto LAB_007f692e;
        }
        uVar23 = (ulong)((*(int *)(local_98 + uVar27) * -0x61c8864f ^ (uint)uVar18) >>
                        (0x18U - cVar4 & 0x1f));
      }
      uVar20 = ((uint)(uVar23 >> 8) & 0xffffff) << (bVar7 & 0x1f);
      if (((ulong)(pUVar3 + uVar20) & 0x3f) != 0) {
LAB_007f769f:
        __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32e,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      if (((ulong)(pBVar14 + uVar20) & ~(-1L << (bVar7 & 0x3f))) != 0) {
LAB_007f7680:
        __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                      ,0x32f,
                      "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
      }
      ms->hashCache[(uint)uVar27 & 7] = (U32)uVar23;
      uVar27 = uVar27 + 1;
    } while (uVar22 + uVar8 != uVar27);
  }
  puVar28 = (ulong *)(srcSize + (long)src);
  if (puVar25 < local_a8) {
    local_90 = (ulong *)((long)puVar28 + -7);
    local_80 = (ulong *)((long)puVar28 + -3);
    local_88 = (ulong *)((long)puVar28 + -1);
    local_50 = puVar28 + -4;
    local_40 = ~(-1L << (bVar7 & 0x3f));
    local_c8 = puVar28;
    uVar20 = local_b8;
    do {
      pZVar6 = local_b0;
      local_a0 = (ulong *)((long)puVar25 + 1);
      lVar16 = -(ulong)uVar21;
      if (uVar21 == 0) {
        uVar27 = 0;
      }
      else {
        uVar27 = 0;
        if (*(int *)((long)local_a0 - (ulong)uVar21) == *(int *)((long)puVar25 + 1)) {
          puVar28 = (ulong *)((long)puVar25 + 5);
          puVar9 = (ulong *)(lVar16 + 5 + (long)puVar25);
          puVar13 = puVar28;
          if (puVar28 < local_90) {
            if (*puVar9 == *puVar28) {
              lVar11 = 0;
              do {
                puVar13 = (ulong *)((long)puVar25 + lVar11 + 0xd);
                if (local_90 <= puVar13) {
                  puVar9 = (ulong *)((long)puVar25 + lVar16 + lVar11 + 0xd);
                  puVar13 = (ulong *)((long)puVar25 + lVar11 + 0xd);
                  goto LAB_007f6ad7;
                }
                uVar27 = *(ulong *)((long)puVar25 + lVar11 + lVar16 + 0xd);
                uVar18 = *puVar13;
                lVar11 = lVar11 + 8;
              } while (uVar27 == uVar18);
              uVar18 = uVar18 ^ uVar27;
              uVar27 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar11;
            }
            else {
              uVar18 = *puVar28 ^ *puVar9;
              uVar27 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                }
              }
              uVar27 = uVar27 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_007f6ad7:
            if ((puVar13 < local_80) && ((int)*puVar9 == (int)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 4);
              puVar9 = (ulong *)((long)puVar9 + 4);
            }
            if ((puVar13 < local_88) && ((short)*puVar9 == (short)*puVar13)) {
              puVar13 = (ulong *)((long)puVar13 + 2);
              puVar9 = (ulong *)((long)puVar9 + 2);
            }
            if (puVar13 < local_c8) {
              puVar13 = (ulong *)((long)puVar13 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar13));
            }
            uVar27 = (long)puVar13 - (long)puVar28;
          }
          uVar27 = uVar27 + 4;
        }
      }
      local_d8 = 999999999;
      local_cc = uVar15;
      local_bc = uVar21;
      if (uVar20 == 6) {
        if (local_d0 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_6_6
                             (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
        }
        else if (local_d0 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_6_5
                             (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_noDict_6_4
                             (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
        }
      }
      else if (uVar20 == 5) {
        if (local_d0 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_5_6
                             (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
        }
        else if (local_d0 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_noDict_5_5
                             (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_noDict_5_4
                             (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
        }
      }
      else if (local_d0 == 6) {
        uVar18 = ZSTD_RowFindBestMatch_noDict_4_6
                           (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
      }
      else if (local_d0 == 5) {
        uVar18 = ZSTD_RowFindBestMatch_noDict_4_5
                           (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
      }
      else {
        uVar18 = ZSTD_RowFindBestMatch_noDict_4_4
                           (local_b0,(BYTE *)puVar25,(BYTE *)local_c8,&local_d8);
      }
      uVar23 = uVar27;
      if (uVar27 < uVar18) {
        uVar23 = uVar18;
      }
      if (uVar23 < 4) {
        uVar27 = (long)puVar25 - (long)src;
        puVar25 = (ulong *)((long)puVar25 + (uVar27 >> 8) + 1);
        pZVar6->lazySkipping = (uint)(0x7ff < uVar27);
        puVar28 = local_c8;
        uVar21 = local_bc;
        uVar15 = local_cc;
      }
      else {
        puVar28 = puVar25;
        uVar24 = local_d8;
        if (uVar18 <= uVar27) {
          puVar28 = local_a0;
          uVar24 = 1;
        }
        local_a0 = puVar28;
        local_58 = lVar16;
        if (puVar25 < local_a8) {
          do {
            puVar28 = (ulong *)((long)puVar25 + 1);
            if (uVar24 == 0) {
              uVar24 = 0;
            }
            else if ((local_bc != 0) && (*(int *)puVar28 == *(int *)((long)puVar28 + local_58))) {
              puVar13 = (ulong *)((long)puVar25 + 5);
              puVar19 = (ulong *)((long)puVar25 + local_58 + 5);
              puVar9 = puVar13;
              if (puVar13 < local_90) {
                if (*puVar19 == *puVar13) {
                  lVar16 = 0;
                  do {
                    puVar9 = (ulong *)((long)puVar25 + lVar16 + 0xd);
                    if (local_90 <= puVar9) {
                      puVar19 = (ulong *)((long)puVar25 + local_58 + lVar16 + 0xd);
                      puVar9 = (ulong *)((long)puVar25 + lVar16 + 0xd);
                      goto LAB_007f6d30;
                    }
                    uVar27 = *(ulong *)((long)puVar25 + lVar16 + local_58 + 0xd);
                    uVar18 = *puVar9;
                    lVar16 = lVar16 + 8;
                  } while (uVar27 == uVar18);
                  uVar18 = uVar18 ^ uVar27;
                  uVar27 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar16;
                }
                else {
                  uVar18 = *puVar13 ^ *puVar19;
                  uVar27 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar27 = uVar27 >> 3 & 0x1fffffff;
                }
              }
              else {
LAB_007f6d30:
                if ((puVar9 < local_80) && ((int)*puVar19 == (int)*puVar9)) {
                  puVar9 = (ulong *)((long)puVar9 + 4);
                  puVar19 = (ulong *)((long)puVar19 + 4);
                }
                if ((puVar9 < local_88) && ((short)*puVar19 == (short)*puVar9)) {
                  puVar9 = (ulong *)((long)puVar9 + 2);
                  puVar19 = (ulong *)((long)puVar19 + 2);
                }
                if (puVar9 < local_c8) {
                  puVar9 = (ulong *)((long)puVar9 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar9));
                }
                uVar27 = (long)puVar9 - (long)puVar13;
              }
              uVar15 = (uint)uVar24;
              if (uVar15 == 0) goto LAB_007f7661;
              if (uVar27 < 0xfffffffffffffffc) {
                uVar20 = 0x1f;
                if (uVar15 != 0) {
                  for (; uVar15 >> uVar20 == 0; uVar20 = uVar20 - 1) {
                  }
                }
                if ((int)((uVar20 ^ 0x1f) + (int)uVar23 * 3 + -0x1e) < (int)(uVar27 + 4) * 3) {
                  uVar24 = 1;
                  uVar23 = uVar27 + 4;
                  local_a0 = puVar28;
                }
              }
            }
            local_d8 = 999999999;
            local_38 = uVar23;
            if (local_b8 == 6) {
              if (local_d0 == 6) {
                uVar27 = ZSTD_RowFindBestMatch_noDict_6_6
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              else if (local_d0 == 5) {
                uVar27 = ZSTD_RowFindBestMatch_noDict_6_5
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar27 = ZSTD_RowFindBestMatch_noDict_6_4
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
            }
            else if (local_b8 == 5) {
              if (local_d0 == 6) {
                uVar27 = ZSTD_RowFindBestMatch_noDict_5_6
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              else if (local_d0 == 5) {
                uVar27 = ZSTD_RowFindBestMatch_noDict_5_5
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar27 = ZSTD_RowFindBestMatch_noDict_5_4
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
            }
            else if (local_d0 == 6) {
              uVar27 = ZSTD_RowFindBestMatch_noDict_4_6
                                 (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
            }
            else if (local_d0 == 5) {
              uVar27 = ZSTD_RowFindBestMatch_noDict_4_5
                                 (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
            }
            else {
              uVar27 = ZSTD_RowFindBestMatch_noDict_4_4
                                 (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
            }
            uVar15 = (uint)local_d8;
            if ((uVar15 == 0) || (uVar20 = (uint)uVar24, uVar20 == 0)) goto LAB_007f7661;
            if (uVar27 < 4) {
LAB_007f6e92:
              uVar23 = local_38;
              if (local_a8 <= puVar28) break;
              puVar28 = (ulong *)((long)puVar25 + 2);
              if ((local_bc != 0) &&
                 (*(int *)((long)puVar25 + 2) == *(int *)((long)puVar25 + local_58 + 2))) {
                puVar13 = (ulong *)((long)puVar25 + 6);
                puVar9 = (ulong *)((long)puVar25 + local_58 + 6);
                puVar19 = puVar13;
                if (puVar13 < local_90) {
                  if (*puVar9 == *puVar13) {
                    puVar19 = (ulong *)((long)puVar25 + 0xe);
                    do {
                      if (local_90 <= puVar19) {
                        puVar9 = (ulong *)(local_58 + (long)puVar19);
                        goto LAB_007f6f3a;
                      }
                      puVar25 = (ulong *)((long)puVar19 + local_58);
                      uVar27 = *puVar19;
                      puVar19 = puVar19 + 1;
                    } while (*puVar25 == uVar27);
                    uVar27 = uVar27 ^ *puVar25;
                    uVar18 = 0;
                    if (uVar27 != 0) {
                      for (; (uVar27 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                      }
                    }
                    puVar19 = (ulong *)((long)puVar19 + ((uVar18 >> 3 & 0x1fffffff) - 8));
                    goto LAB_007f6f7e;
                  }
                  uVar18 = *puVar13 ^ *puVar9;
                  uVar27 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                    }
                  }
                  uVar27 = uVar27 >> 3 & 0x1fffffff;
                }
                else {
LAB_007f6f3a:
                  if ((puVar19 < local_80) && ((int)*puVar9 == (int)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 4);
                    puVar9 = (ulong *)((long)puVar9 + 4);
                  }
                  if ((puVar19 < local_88) && ((short)*puVar9 == (short)*puVar19)) {
                    puVar19 = (ulong *)((long)puVar19 + 2);
                    puVar9 = (ulong *)((long)puVar9 + 2);
                  }
                  if (puVar19 < local_c8) {
                    puVar19 = (ulong *)((long)puVar19 + (ulong)((BYTE)*puVar9 == (BYTE)*puVar19));
                  }
LAB_007f6f7e:
                  uVar27 = (long)puVar19 - (long)puVar13;
                  if (0xfffffffffffffffb < uVar27) goto LAB_007f6fb3;
                }
                uVar15 = 0x1f;
                if (uVar20 != 0) {
                  for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                  }
                }
                if ((int)((uVar15 ^ 0x1f) + (int)local_38 * 4 + -0x1e) < (int)(uVar27 + 4) * 4) {
                  uVar24 = 1;
                  uVar23 = uVar27 + 4;
                  local_a0 = puVar28;
                }
              }
LAB_007f6fb3:
              local_d8 = 999999999;
              if (local_b8 == 6) {
                if (local_d0 == 6) {
                  uVar27 = ZSTD_RowFindBestMatch_noDict_6_6
                                     (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
                }
                else if (local_d0 == 5) {
                  uVar27 = ZSTD_RowFindBestMatch_noDict_6_5
                                     (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
                }
                else {
                  uVar27 = ZSTD_RowFindBestMatch_noDict_6_4
                                     (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
                }
              }
              else if (local_b8 == 5) {
                if (local_d0 == 6) {
                  uVar27 = ZSTD_RowFindBestMatch_noDict_5_6
                                     (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
                }
                else if (local_d0 == 5) {
                  uVar27 = ZSTD_RowFindBestMatch_noDict_5_5
                                     (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
                }
                else {
                  uVar27 = ZSTD_RowFindBestMatch_noDict_5_4
                                     (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
                }
              }
              else if (local_d0 == 6) {
                uVar27 = ZSTD_RowFindBestMatch_noDict_4_6
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              else if (local_d0 == 5) {
                uVar27 = ZSTD_RowFindBestMatch_noDict_4_5
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              else {
                uVar27 = ZSTD_RowFindBestMatch_noDict_4_4
                                   (local_b0,(BYTE *)puVar28,(BYTE *)local_c8,&local_d8);
              }
              uVar15 = (uint)local_d8;
              if ((uVar15 == 0) || (uVar20 = (uint)uVar24, uVar20 == 0)) {
LAB_007f7661:
                __assert_fail("val != 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bits.h"
                              ,0xab,"unsigned int ZSTD_highbit32(U32)");
              }
              if (uVar27 < 4) break;
              iVar12 = 0x1f;
              if (uVar15 != 0) {
                for (; uVar15 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                }
              }
              uVar15 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              if ((int)uVar27 * 4 - iVar12 <= (int)((uVar15 ^ 0x1f) + (int)uVar23 * 4 + -0x18))
              break;
            }
            else {
              iVar12 = 0x1f;
              if (uVar15 != 0) {
                for (; uVar15 >> iVar12 == 0; iVar12 = iVar12 + -1) {
                }
              }
              uVar15 = 0x1f;
              if (uVar20 != 0) {
                for (; uVar20 >> uVar15 == 0; uVar15 = uVar15 - 1) {
                }
              }
              if ((int)uVar27 * 4 - iVar12 <= (int)((uVar15 ^ 0x1f) + (int)local_38 * 4 + -0x1b))
              goto LAB_007f6e92;
            }
            uVar23 = uVar27;
            uVar24 = local_d8;
            puVar25 = puVar28;
            local_a0 = puVar28;
          } while (puVar28 < local_a8);
        }
        psVar26 = local_78;
        puVar25 = local_a0;
        uVar21 = local_bc;
        if (3 < uVar24) {
          if ((src < local_a0) && (local_60 < (BYTE *)((long)local_a0 + (3 - uVar24)))) {
            puVar28 = local_a0;
            while (puVar25 = puVar28,
                  *(BYTE *)((long)puVar28 + -1) == *(BYTE *)((long)puVar28 + (2 - uVar24))) {
              puVar25 = (ulong *)((long)puVar28 + -1);
              uVar23 = uVar23 + 1;
              if ((puVar25 <= src) ||
                 (pBVar14 = (BYTE *)((long)puVar28 + (2 - uVar24)), puVar28 = puVar25,
                 pBVar14 <= local_60)) break;
            }
          }
          uVar21 = (U32)uVar24 - 3;
          local_cc = local_bc;
        }
        if (local_78->maxNbSeq <=
            (ulong)((long)local_78->sequences - (long)local_78->sequencesStart >> 3)) {
LAB_007f771b:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29d,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0x20000 < local_78->maxNbLit) {
LAB_007f76dd:
          __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x29f,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar27 = (long)puVar25 - (long)src;
        puVar28 = (ulong *)local_78->lit;
        if (local_78->litStart + local_78->maxNbLit < (BYTE *)((long)puVar28 + uVar27)) {
LAB_007f76be:
          __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_c8 < puVar25) {
LAB_007f76fc:
          __assert_fail("literals + litLength <= litLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2a1,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (local_50 < puVar25) {
          ZSTD_safecopyLiterals((BYTE *)puVar28,(BYTE *)src,(BYTE *)puVar25,(BYTE *)local_50);
LAB_007f7195:
          psVar26->lit = psVar26->lit + uVar27;
          if (0xffff < uVar27) {
            if (psVar26->longLengthType != ZSTD_llt_none) {
              __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                            ,0x2b2,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
            psVar26->longLengthType = ZSTD_llt_literalLength;
            psVar26->longLengthPos =
                 (U32)((ulong)((long)psVar26->sequences - (long)psVar26->sequencesStart) >> 3);
          }
        }
        else {
          uVar18 = *(ulong *)((long)src + 8);
          *puVar28 = *src;
          puVar28[1] = uVar18;
          pBVar14 = local_78->lit;
          if (0x10 < uVar27) {
            if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
            {
              __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                            ,0xe9,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
            uVar18 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar14 + 0x18) = uVar18;
            if (0x20 < (long)uVar27) {
              lVar16 = 0;
              do {
                puVar2 = (undefined8 *)((long)src + lVar16 + 0x20);
                uVar5 = puVar2[1];
                pBVar1 = pBVar14 + lVar16 + 0x20;
                *(undefined8 *)pBVar1 = *puVar2;
                *(undefined8 *)(pBVar1 + 8) = uVar5;
                puVar2 = (undefined8 *)((long)src + lVar16 + 0x30);
                uVar5 = puVar2[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar2;
                *(undefined8 *)(pBVar1 + 0x18) = uVar5;
                lVar16 = lVar16 + 0x20;
              } while (pBVar1 + 0x20 < pBVar14 + uVar27);
            }
            goto LAB_007f7195;
          }
          local_78->lit = pBVar14 + uVar27;
        }
        uVar20 = local_b8;
        puVar28 = local_c8;
        psVar17 = psVar26->sequences;
        psVar17->litLength = (U16)uVar27;
        psVar17->offBase = (U32)uVar24;
        if (uVar23 < 3) {
LAB_007f773a:
          __assert_fail("matchLength >= MINMATCH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,700,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        if (0xffff < uVar23 - 3) {
          if (psVar26->longLengthType != ZSTD_llt_none) {
LAB_007f7759:
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2bf,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          psVar26->longLengthType = ZSTD_llt_matchLength;
          psVar26->longLengthPos =
               (U32)((ulong)((long)psVar17 - (long)psVar26->sequencesStart) >> 3);
        }
        psVar17->mlBase = (U16)(uVar23 - 3);
        psVar17 = psVar17 + 1;
        psVar26->sequences = psVar17;
        if (local_b0->lazySkipping != 0) {
          uVar15 = local_b0->nextToUpdate;
          uVar27 = (ulong)uVar15;
          uVar8 = ((int)local_a8 - (int)(local_98 + uVar27)) + 1;
          if (7 < uVar8) {
            uVar8 = 8;
          }
          if (local_a8 < local_98 + uVar27) {
            uVar8 = 0;
          }
          local_bc = uVar21;
          if (uVar15 < uVar8 + uVar15) {
            if (0x20 < local_b0->rowHashLog + 8) goto LAB_007f7778;
            pUVar3 = local_b0->hashTable;
            pBVar14 = local_b0->tagTable;
            uVar18 = local_b0->hashSalt;
            cVar4 = (char)local_b0->rowHashLog;
            do {
              if (local_b8 == 5) {
                uVar24 = *(long *)(local_98 + uVar27) * -0x30e4432345000000;
LAB_007f735e:
                uVar24 = (uVar24 ^ uVar18) >> (0x38U - cVar4 & 0x3f);
              }
              else {
                if (local_b8 == 6) {
                  uVar24 = *(long *)(local_98 + uVar27) * -0x30e4432340650000;
                  goto LAB_007f735e;
                }
                uVar24 = (ulong)((*(int *)(local_98 + uVar27) * -0x61c8864f ^ (uint)uVar18) >>
                                (0x18U - cVar4 & 0x1f));
              }
              uVar22 = ((uint)(uVar24 >> 8) & 0xffffff) << ((byte)local_d0 & 0x1f);
              if (((ulong)(pUVar3 + uVar22) & 0x3f) != 0) goto LAB_007f769f;
              if ((local_40 & (ulong)(pBVar14 + uVar22)) != 0) goto LAB_007f7680;
              local_b0->hashCache[(uint)uVar27 & 7] = (U32)uVar24;
              uVar27 = uVar27 + 1;
              psVar26 = local_78;
            } while (uVar8 + uVar15 != uVar27);
          }
          local_b0->lazySkipping = 0;
        }
        puVar25 = (ulong *)((long)puVar25 + uVar23);
        src = puVar25;
        uVar15 = local_cc;
        if ((local_cc != 0) && (uVar8 = local_cc, puVar25 <= local_a8)) {
          while (uVar22 = uVar21, src = puVar25, uVar21 = uVar22, uVar15 = uVar8,
                (int)*puVar25 == *(int *)((long)puVar25 - (ulong)uVar8)) {
            lVar16 = -(ulong)uVar8;
            puVar13 = (ulong *)((long)puVar25 + 4);
            puVar19 = (ulong *)((long)puVar25 + lVar16 + 4);
            puVar9 = puVar13;
            if (puVar13 < local_90) {
              if (*puVar19 == *puVar13) {
                lVar11 = 0;
                do {
                  puVar9 = (ulong *)((long)puVar25 + lVar11 + 0xc);
                  if (local_90 <= puVar9) {
                    puVar19 = (ulong *)((long)puVar25 + lVar16 + lVar11 + 0xc);
                    puVar9 = (ulong *)((long)puVar25 + lVar11 + 0xc);
                    goto LAB_007f74b8;
                  }
                  uVar27 = *(ulong *)((long)puVar25 + lVar11 + lVar16 + 0xc);
                  uVar18 = *puVar9;
                  lVar11 = lVar11 + 8;
                } while (uVar27 == uVar18);
                uVar18 = uVar18 ^ uVar27;
                uVar27 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = (uVar27 >> 3 & 0x1fffffff) + lVar11;
              }
              else {
                uVar18 = *puVar13 ^ *puVar19;
                uVar27 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar27 & 1) == 0; uVar27 = uVar27 + 1) {
                  }
                }
                uVar27 = uVar27 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_007f74b8:
              if ((puVar9 < local_80) && ((int)*puVar19 == (int)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 4);
                puVar19 = (ulong *)((long)puVar19 + 4);
              }
              if ((puVar9 < local_88) && ((short)*puVar19 == (short)*puVar9)) {
                puVar9 = (ulong *)((long)puVar9 + 2);
                puVar19 = (ulong *)((long)puVar19 + 2);
              }
              if (puVar9 < puVar28) {
                puVar9 = (ulong *)((long)puVar9 + (ulong)((BYTE)*puVar19 == (BYTE)*puVar9));
              }
              uVar27 = (long)puVar9 - (long)puVar13;
            }
            if (psVar26->maxNbSeq <= (ulong)((long)psVar17 - (long)psVar26->sequencesStart >> 3))
            goto LAB_007f771b;
            if (0x20000 < psVar26->maxNbLit) goto LAB_007f76dd;
            puVar13 = (ulong *)psVar26->lit;
            if (psVar26->litStart + psVar26->maxNbLit < puVar13) goto LAB_007f76be;
            if (puVar28 < puVar25) goto LAB_007f76fc;
            if (local_50 < puVar25) {
              ZSTD_safecopyLiterals
                        ((BYTE *)puVar13,(BYTE *)puVar25,(BYTE *)puVar25,(BYTE *)local_50);
              psVar26 = local_78;
            }
            else {
              uVar18 = puVar25[1];
              *puVar13 = *puVar25;
              puVar13[1] = uVar18;
            }
            psVar17 = psVar26->sequences;
            psVar17->litLength = 0;
            psVar17->offBase = 1;
            if (uVar27 + 4 < 3) goto LAB_007f773a;
            if (0xffff < uVar27 + 1) {
              if (psVar26->longLengthType != ZSTD_llt_none) goto LAB_007f7759;
              psVar26->longLengthType = ZSTD_llt_matchLength;
              psVar26->longLengthPos =
                   (U32)((ulong)((long)psVar17 - (long)psVar26->sequencesStart) >> 3);
            }
            psVar17->mlBase = (U16)(uVar27 + 1);
            psVar17 = psVar17 + 1;
            psVar26->sequences = psVar17;
            puVar25 = (ulong *)((long)puVar25 + uVar27 + 4);
            src = puVar25;
            uVar21 = uVar8;
            uVar15 = uVar22;
            if ((uVar22 == 0) || (uVar8 = uVar22, local_a8 < puVar25)) break;
          }
        }
      }
      local_cc = uVar15;
    } while (puVar25 < local_a8);
  }
  if (local_6c <= local_64) {
    local_6c = 0;
  }
  uVar15 = local_6c;
  if (uVar21 != 0) {
    uVar15 = local_68;
  }
  if (local_68 <= local_64) {
    uVar15 = local_6c;
    local_68 = 0;
  }
  if (uVar21 != 0) {
    local_68 = uVar21;
  }
  if (local_cc != 0) {
    uVar15 = local_cc;
  }
  *local_48 = local_68;
  local_48[1] = uVar15;
  return (long)puVar28 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy2_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_noDict);
}